

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.cpp
# Opt level: O0

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::StoreLPJointObservation::Store
          (StoreLPJointObservation *this)

{
  ostream *this_00;
  EParse *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  stringstream msg;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_000002b0;
  Index in_stack_000002bc;
  StoreLPJointObservation *in_stack_000002c0;
  stringstream *in_stack_fffffffffffffe28;
  value_type_conflict1 *in_stack_fffffffffffffe38;
  stringstream local_190 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe80;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa4433b);
  if (((ulong)(in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish & 1) == 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    MatchingJointObservations(in_stack_000002c0,in_stack_000002bc,in_stack_000002b0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_RDI);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa44484);
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa4435e);
    if ((in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start[0x10] != 2) {
      std::__cxx11::stringstream::stringstream(local_190);
      this_00 = std::operator<<((ostream *)&stack0xfffffffffffffe80,
                                "StoreLPJointObservation::Store() requires that last parsed element is a UINT! (last parsed index was a joint action index)"
                               );
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      this_01 = (EParse *)__cxa_allocate_exception(0x28);
      EParse::EParse(this_01,in_stack_fffffffffffffe28);
      __cxa_throw(this_01,&EParse::typeinfo,EParse::~EParse);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (in_RDI,in_stack_fffffffffffffe38);
  }
  return;
}

Assistant:

void ParserPOMDPFormat_Spirit::StoreLPJointObservation::Store() const
{
    _m_po->_m_lp_JOI.clear();
    if(_m_isJointObservationIndex) //as opposed to parsing individual indices
    {
        //_m_lp_JO not necessary: clear it.
        _m_po->_m_lp_JO.clear();
        //do check that the last parsed element was a index (uint)
        if (_m_po->_m_lp_type != UINT)
        {
            stringstream msg;
            msg << "StoreLPJointObservation::Store() requires that last parsed element is a UINT! (last parsed index was a joint action index)"<< endl;
            throw EParse(msg);
        }
        _m_po->_m_lp_JOI.push_back(_m_po->_m_lp_uint);
        return;
    }
    MatchingJointObservations(0,_m_po->_m_lp_JO); 
    _m_po->_m_lp_JO.clear();
}